

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

DynamicObject * __thiscall
Js::DebugManager::GetConsoleScope(DebugManager *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *pDVar4;
  JavascriptLibrary *this_00;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  DebugManager *this_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x87,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pDVar4 = Memory::RecyclerRootPtr::operator_cast_to_DynamicObject_
                     ((RecyclerRootPtr *)&this->pConsoleScope);
  if (pDVar4 == (DynamicObject *)0x0) {
    this_00 = ScriptContext::GetLibrary(scriptContext);
    pDVar4 = JavascriptLibrary::CreateConsoleScopeActivationObject(this_00);
    recycler = ThreadContext::GetRecycler(this->pThreadContext);
    Memory::RecyclerRootPtr<Js::DynamicObject>::Root(&this->pConsoleScope,pDVar4,recycler);
  }
  pDVar4 = Memory::RecyclerRootPtr::operator_cast_to_DynamicObject_
                     ((RecyclerRootPtr *)&this->pConsoleScope);
  pDVar4 = (DynamicObject *)CrossSite::MarshalVar(scriptContext,pDVar4,false);
  return pDVar4;
}

Assistant:

DynamicObject* DebugManager::GetConsoleScope(ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        if (!this->pConsoleScope)
        {
            this->pConsoleScope.Root(scriptContext->GetLibrary()->CreateConsoleScopeActivationObject(), this->pThreadContext->GetRecycler());
        }

        return (DynamicObject*)CrossSite::MarshalVar(scriptContext, (Var)this->pConsoleScope);
    }